

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_with_multiple_asset_Test::TestBody
          (CoinSelection_SelectCoins_KnapsackSolver_with_multiple_asset_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  key_type *__k;
  mapped_type_conflict *pmVar7;
  char *in_R9;
  Amount AVar8;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  CoinSelectionOption *in_stack_000001d8;
  UtxoFilter *in_stack_000001e0;
  AssertionResult gtest_ar_7;
  CoinSelection *in_stack_000001f8;
  Amount *in_stack_00000210;
  AssertionResult gtest_ar_6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_00000228;
  AmountMap *in_stack_00000230;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  ConfidentialAssetId *in_stack_fffffffffffffab8;
  CoinSelectionOption *in_stack_fffffffffffffac0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffac8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffad8;
  key_type *in_stack_fffffffffffffaf8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *in_stack_fffffffffffffb00;
  string local_450;
  AssertHelper local_430;
  Message local_428;
  string local_420;
  byte local_3f9;
  AssertionResult local_3f8;
  string local_3e8;
  AssertHelper local_3c8;
  Message local_3c0;
  string local_3b8;
  byte local_391;
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378;
  undefined4 local_36c;
  size_type local_368;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_33c;
  int64_t local_338;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  string local_308;
  AssertionResult local_2e8;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined4 local_2c4;
  string local_2c0;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  size_type local_278;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined8 local_250;
  AssertionResult local_248;
  AssertHelper local_238;
  Message local_230;
  undefined8 local_228;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208;
  undefined4 local_1fc;
  size_type local_1f8;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8 [8];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_198;
  char local_180 [104];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_118 [2];
  _func_int **local_e8;
  undefined1 local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [64];
  string local_88;
  string local_58 [2];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x272f4c);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_58,&exp_dummy_asset_a);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  *pmVar2 = 0x25402d4;
  std::__cxx11::string::~string((string *)local_58);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_88,&exp_dummy_asset_b);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  *pmVar2 = 25000000;
  std::__cxx11::string::~string((string *)&local_88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x272ffb);
  cfd::core::Amount::Amount((Amount *)local_c8);
  AVar8 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_e8 = (_func_int **)AVar8.amount_;
  local_e0 = AVar8.ignore_check_;
  local_d8._0_8_ = local_e8;
  local_d8[8] = local_e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x27306e);
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x2730a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetElementsUtxoList();
      in_stack_fffffffffffffad0 = local_118;
      in_stack_fffffffffffffac8 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_c8;
      in_stack_fffffffffffffac0 = (CoinSelectionOption *)(local_c8 + 0x10);
      in_stack_fffffffffffffab8 = (ConfidentialAssetId *)local_d8;
      in_stack_fffffffffffffad8 = (char *)0x0;
      in_R9 = local_180;
      cfd::CoinSelection::SelectCoins
                (in_stack_000001f8,(AmountMap *)gtest_ar_7.message_.ptr_,
                 (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)gtest_ar_7._0_8_,in_stack_000001e0
                 ,in_stack_000001d8,in_stack_00000210,(AmountMap *)gtest_ar_6._0_8_,
                 (Amount *)gtest_ar_6.message_.ptr_,in_stack_00000228,in_stack_00000230);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffad0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffad0);
    }
  }
  else {
    testing::Message::Message(local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4c5,
               "Expected: ret = exp_selection.SelectCoins( map_target_amount, GetElementsUtxoList(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1e0,local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message((Message *)0x27331f);
  }
  local_1f8 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_198);
  local_1fc = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (unsigned_long *)in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x273414);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4c7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message((Message *)0x273477);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2734cf);
  sVar4 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_198);
  if (sVar4 == 2) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_198,0);
    local_228 = 0x19abe00;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (unsigned_long *)in_stack_fffffffffffffac8,(long *)in_stack_fffffffffffffac0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27359e);
      testing::internal::AssertHelper::AssertHelper
                (&local_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4c9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_238,&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_238);
      testing::Message::~Message((Message *)0x273601);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x273656);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_198,1);
    local_250 = 0x4a817c8;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (unsigned_long *)in_stack_fffffffffffffac8,(long *)in_stack_fffffffffffffac0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27370f);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4ca,pcVar3);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message((Message *)0x273772);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2737c7);
  }
  local_278 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x2737e8);
  local_27c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (unsigned_long *)in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x273885);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4cc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x2738e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x273940);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x27394d);
  if (sVar5 == 2) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2c0,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[](in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    local_2c4 = 0x4a817c8;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (long *)in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
    std::__cxx11::string::~string((string *)&local_2c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x273a66);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4ce,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
      testing::Message::~Message((Message *)0x273ac9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x273b21);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_308,&exp_dummy_asset_b);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[](in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    local_30c = 0x19abe00;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
               (long *)in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
    std::__cxx11::string::~string((string *)&local_308);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x273c2a);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4cf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message((Message *)0x273c87);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x273cdc);
  }
  local_338 = cfd::core::Amount::GetSatoshiValue((Amount *)local_c8);
  local_33c = 0xe10;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (long *)in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x273da0);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4d1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message((Message *)0x273dfd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x273e52);
  local_368 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x273e5f);
  local_36c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,
             (unsigned_long *)in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    in_stack_fffffffffffffb00 =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x273f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4d2,(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message((Message *)0x273f65);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x273fbd);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x273fca);
  if (sVar6 == 2) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3b8,&exp_dummy_asset_a);
    __k = (key_type *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    local_391 = ~(byte)__k->_M_dataplus & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffac0,(bool *)in_stack_fffffffffffffab8,
               (type *)0x274031);
    std::__cxx11::string::~string((string *)&local_3b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3e8,(internal *)&local_390,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4d4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      testing::Message::~Message((Message *)0x27415c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2741d7);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_420,&exp_dummy_asset_b);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)in_stack_fffffffffffffb00,__k);
    local_3f9 = ~*pmVar7 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffac0,(bool *)in_stack_fffffffffffffab8,
               (type *)0x274234);
    std::__cxx11::string::~string((string *)&local_420);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
    if (!bVar1) {
      testing::Message::Message(&local_428);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_450,(internal *)&local_3f8,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_430,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4d5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_430,&local_428);
      testing::internal::AssertHelper::~AssertHelper(&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      testing::Message::~Message((Message *)0x27435f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2743d7);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffad0);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x274402);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x27440f);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27441c);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x274429);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_with_multiple_asset)
{
  // Same condition with "KnapsackSolver_match_utxo" and the other
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 39060180;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 25000000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 2);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(26918400));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(78125000));
  }
  EXPECT_EQ(map_select_value.size(), 2);
  if (map_select_value.size() == 2) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 78125000);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 26918400);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  EXPECT_EQ(map_searched_bnb.size(), 2);
  if (map_searched_bnb.size() == 2) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
  }
}